

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::SmallVector<int,_10UL>_>::emplaceRealloc<>
          (SmallVectorBase<slang::SmallVector<int,_10UL>_> *this,pointer pos)

{
  ulong uVar1;
  size_type sVar2;
  pointer pSVar3;
  SmallVector<int,_10UL> *pSVar4;
  long *plVar5;
  size_type sVar6;
  Base *ctx;
  Base *other;
  SmallVector<int,_10UL> *pSVar7;
  long lVar8;
  Base *pBVar9;
  
  if (this->len == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  pBVar9 = (Base *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (Base *)(uVar1 * 2);
  if (pBVar9 < ctx) {
    pBVar9 = ctx;
  }
  if (0x1ffffffffffffff - uVar1 < uVar1) {
    pBVar9 = (Base *)0x1ffffffffffffff;
  }
  lVar8 = (long)pos - (long)this->data_;
  pSVar4 = (SmallVector<int,_10UL> *)operator_new((long)pBVar9 << 6);
  plVar5 = (long *)((long)pSVar4 + lVar8);
  *plVar5 = (long)(plVar5 + 3);
  plVar5[1] = 0;
  plVar5[2] = 10;
  other = &this->data_->super_SmallVectorBase<int>;
  sVar2 = this->len;
  sVar6 = sVar2 * 0x40;
  pSVar7 = pSVar4;
  if (other + sVar2 * 2 == &pos->super_SmallVectorBase<int>) {
    while (sVar2 != 0) {
      ctx = other;
      SmallVector<int,_10UL>::SmallVector(pSVar7,other);
      other = other + 2;
      sVar6 = sVar6 - 0x40;
      pSVar7 = pSVar7 + 1;
      sVar2 = sVar6;
    }
  }
  else {
    for (; other != &pos->super_SmallVectorBase<int>; other = other + 2) {
      ctx = other;
      SmallVector<int,_10UL>::SmallVector(pSVar7,other);
      pSVar7 = pSVar7 + 1;
    }
    sVar2 = this->len;
    pSVar3 = this->data_;
    if (&pSVar3[sVar2].super_SmallVectorBase<int> != &pos->super_SmallVectorBase<int>) {
      pSVar7 = (SmallVector<int,_10UL> *)(lVar8 + (long)pSVar4);
      do {
        pSVar7 = pSVar7 + 1;
        ctx = &pos->super_SmallVectorBase<int>;
        SmallVector<int,_10UL>::SmallVector(pSVar7,&pos->super_SmallVectorBase<int>);
        pos = (pointer)((long)pos + 0x40);
      } while ((Base *)pos != &pSVar3[sVar2].super_SmallVectorBase<int>);
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pBVar9;
  this->data_ = pSVar4;
  return (pointer)((long)pSVar4 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}